

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_json.cc
# Opt level: O1

QPDFObjectHandle __thiscall QPDF::JSONReactor::makeObject(JSONReactor *this,JSON *value)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  double num;
  undefined8 uVar2;
  undefined8 uVar3;
  _Alloc_hider _Var4;
  size_type sVar5;
  element_type *peVar6;
  bool bVar7;
  longlong value_00;
  long lVar8;
  qpdf_offset_t offset;
  logic_error *this_00;
  undefined1 in_CL;
  JSON *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var9;
  QPDFObjectHandle QVar10;
  bool bool_v;
  string str;
  string str_v;
  int gen;
  int obj;
  bool local_d9;
  undefined1 local_d8 [32];
  undefined1 local_b8 [16];
  undefined1 local_a8 [24];
  string local_90;
  int local_70;
  int local_6c;
  string local_68;
  QPDFObjectHandle local_48;
  
  (this->super_Reactor)._vptr_Reactor = (_func_int **)0x0;
  this->pdf = (QPDF *)0x0;
  local_90._M_string_length = 0;
  local_90.field_2._M_local_buf[0] = '\0';
  local_d9 = false;
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  bVar7 = JSON::isDictionary(in_RDX);
  if (bVar7) {
    QPDFObjectHandle::newDictionary();
  }
  else {
    bVar7 = JSON::isArray(in_RDX);
    if (!bVar7) {
      bVar7 = JSON::isNull(in_RDX);
      if (bVar7) {
        QPDFObjectHandle::newNull();
      }
      else {
        bVar7 = JSON::getBool(in_RDX,&local_d9);
        if (bVar7) {
          QPDFObjectHandle::newBool((QPDFObjectHandle *)local_b8,local_d9);
        }
        else {
          bVar7 = JSON::getNumber(in_RDX,(string *)(local_a8 + 0x18));
          if (!bVar7) {
            bVar7 = JSON::getString(in_RDX,(string *)(local_a8 + 0x18));
            if (!bVar7) goto LAB_00210f78;
            local_6c = 0;
            local_70 = 0;
            local_b8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            local_a8[0] = 0;
            local_b8._0_8_ = (element_type *)local_a8;
            bVar7 = is_indirect_object((string *)(local_a8 + 0x18),&local_6c,&local_70);
            if (bVar7) {
              getObjectForJSON((QPDF *)local_d8,
                               (int)(value->m).
                                    super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                                    _M_refcount._M_pi,local_6c);
LAB_00211187:
              uVar3 = local_d8._8_8_;
              uVar2 = local_d8._0_8_;
              local_d8._0_8_ =
                   (__uniq_ptr_data<QPDF::Members,_std::default_delete<QPDF::Members>,_true,_true>)
                   0x0;
              local_d8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this->pdf;
              (this->super_Reactor)._vptr_Reactor = (_func_int **)uVar2;
              this->pdf = (QPDF *)uVar3;
              if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
              }
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_ !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_);
              }
            }
            else {
              bVar7 = is_unicode_string((string *)(local_a8 + 0x18),(string *)local_b8);
              if (bVar7) {
                QPDFObjectHandle::newUnicodeString((QPDFObjectHandle *)local_d8,(string *)local_b8);
                goto LAB_00211187;
              }
              bVar7 = is_binary_string((string *)(local_a8 + 0x18),(string *)local_b8);
              if (!bVar7) {
                if ((local_90._M_string_length < 2) || (*local_90._M_dataplus._M_p != '/')) {
                  bVar7 = is_pdf_name((string *)(local_a8 + 0x18));
                  if (bVar7) {
                    std::__cxx11::string::substr((ulong)local_d8,(ulong)(local_a8 + 0x18));
                    local_68._M_dataplus._M_p = (pointer)((long)&local_68 + 0x10U);
                    std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"");
                    QPDFObjectHandle::parse(&local_48,(string *)local_d8,&local_68);
                    _Var9._M_pi = local_48.super_BaseHandle.obj.
                                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_refcount._M_pi;
                    peVar6 = local_48.super_BaseHandle.obj.
                             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
                    local_48.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                         (element_type *)0x0;
                    local_48.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                    p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this->pdf;
                    (this->super_Reactor)._vptr_Reactor = (_func_int **)peVar6;
                    this->pdf = (QPDF *)_Var9._M_pi;
                    if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
                    }
                    if (local_48.super_BaseHandle.obj.
                        super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                (local_48.super_BaseHandle.obj.
                                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_refcount._M_pi);
                    }
                    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._M_dataplus._M_p !=
                        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((long)&local_68 + 0x10U)) {
                      operator_delete(local_68._M_dataplus._M_p,
                                      local_68.field_2._M_allocated_capacity + 1);
                    }
                    goto LAB_0021132b;
                  }
                  offset = JSON::getStart(in_RDX);
                  local_d8._0_8_ = (long)local_d8 + 0x10;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_d8,"unrecognized string value","");
                  error((JSONReactor *)value,offset,(string *)local_d8);
                  if ((Members *)local_d8._0_8_ != (Members *)(local_d8 + 0x10)) {
                    operator_delete((void *)local_d8._0_8_,local_d8._16_8_ + 1);
                  }
                  QPDFObjectHandle::newNull();
                }
                else {
                  QPDFObjectHandle::newName
                            ((QPDFObjectHandle *)local_d8,(string *)(local_a8 + 0x18));
                }
                goto LAB_00211187;
              }
              QUtil::hex_decode((string *)local_d8,(string *)local_b8);
              QPDFObjectHandle::newString((QPDFObjectHandle *)&local_68,(string *)local_d8);
              sVar5 = local_68._M_string_length;
              _Var4._M_p = local_68._M_dataplus._M_p;
              local_68._M_dataplus._M_p = (pointer)0x0;
              local_68._M_string_length = 0;
              p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this->pdf;
              (this->super_Reactor)._vptr_Reactor = (_func_int **)_Var4._M_p;
              this->pdf = (QPDF *)sVar5;
              if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
              }
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._M_string_length !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._M_string_length
                          );
              }
LAB_0021132b:
              if (local_d8._0_8_ != (long)local_d8 + 0x10) {
                operator_delete((void *)local_d8._0_8_,local_d8._16_8_ + 1);
              }
            }
            if ((element_type *)local_b8._0_8_ != (element_type *)local_a8) {
              operator_delete((void *)local_b8._0_8_,CONCAT71(local_a8._1_7_,local_a8[0]) + 1);
            }
            goto LAB_00210f78;
          }
          bVar7 = QUtil::is_long_long(local_90._M_dataplus._M_p);
          if (bVar7) {
            value_00 = QUtil::string_to_ll(local_90._M_dataplus._M_p);
            QPDFObjectHandle::newInteger((QPDFObjectHandle *)local_b8,value_00);
            goto LAB_00211000;
          }
          lVar8 = std::__cxx11::string::find((char)local_a8 + '\x18',0x65);
          if (lVar8 == -1) {
            lVar8 = std::__cxx11::string::find((char)local_a8 + '\x18',0x45);
            if (lVar8 != -1) goto LAB_00211107;
          }
          else {
LAB_00211107:
            num = std::__cxx11::stod((string *)(local_a8 + 0x18),(size_t *)0x0);
            QUtil::double_to_string_abi_cxx11_((string *)local_b8,(QUtil *)0x0,num,1,(bool)in_CL);
            std::__cxx11::string::operator=((string *)(local_a8 + 0x18),(string *)local_b8);
            if ((element_type *)local_b8._0_8_ != (element_type *)local_a8) {
              operator_delete((void *)local_b8._0_8_,CONCAT71(local_a8._1_7_,local_a8[0]) + 1);
            }
          }
          QPDFObjectHandle::newReal((QPDFObjectHandle *)local_b8,(string *)(local_a8 + 0x18));
        }
      }
LAB_00211000:
      uVar3 = local_b8._8_8_;
      uVar2 = local_b8._0_8_;
      local_b8._0_8_ = (element_type *)0x0;
      local_b8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this->pdf;
      (this->super_Reactor)._vptr_Reactor = (_func_int **)uVar2;
      this->pdf = (QPDF *)uVar3;
      if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_);
      }
      goto LAB_00210f78;
    }
    QPDFObjectHandle::newArray();
  }
  uVar3 = local_b8._8_8_;
  uVar2 = local_b8._0_8_;
  local_b8._0_8_ = (element_type *)0x0;
  local_b8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this->pdf;
  (this->super_Reactor)._vptr_Reactor = (_func_int **)uVar2;
  this->pdf = (QPDF *)uVar3;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_);
  }
  value[8].m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)(this->super_Reactor)._vptr_Reactor;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&value[8].m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (__shared_count<(__gnu_cxx::_Lock_policy)2> *)&this->pdf);
  *(undefined4 *)&value[9].m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       7;
LAB_00210f78:
  if ((this->super_Reactor)._vptr_Reactor != (_func_int **)0x0) {
    bVar7 = QPDFObjectHandle::hasObjectDescription((QPDFObjectHandle *)this);
    _Var9._M_pi = extraout_RDX;
    if (!bVar7) {
      setObjectDescription((JSONReactor *)value,(QPDFObjectHandle *)this,in_RDX);
      _Var9._M_pi = extraout_RDX_00;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,
                      CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                               local_90.field_2._M_local_buf[0]) + 1);
      _Var9._M_pi = extraout_RDX_01;
    }
    QVar10.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = _Var9._M_pi;
    QVar10.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this;
    return (QPDFObjectHandle)
           QVar10.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(this_00,"JSONReactor::makeObject didn\'t initialize the object");
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

QPDFObjectHandle
QPDF::JSONReactor::makeObject(JSON const& value)
{
    QPDFObjectHandle result;
    std::string str_v;
    bool bool_v = false;
    if (value.isDictionary()) {
        result = QPDFObjectHandle::newDictionary();
        next_obj = result;
        next_state = st_object;
    } else if (value.isArray()) {
        result = QPDFObjectHandle::newArray();
        next_obj = result;
        next_state = st_object;
    } else if (value.isNull()) {
        result = QPDFObjectHandle::newNull();
    } else if (value.getBool(bool_v)) {
        result = QPDFObjectHandle::newBool(bool_v);
    } else if (value.getNumber(str_v)) {
        if (QUtil::is_long_long(str_v.c_str())) {
            result = QPDFObjectHandle::newInteger(QUtil::string_to_ll(str_v.c_str()));
        } else {
            // JSON allows scientific notation, but PDF does not.
            if (str_v.find('e') != std::string::npos || str_v.find('E') != std::string::npos) {
                try {
                    auto v = std::stod(str_v);
                    str_v = QUtil::double_to_string(v);
                } catch (std::exception&) {
                    // Keep it as it was
                }
            }
            result = QPDFObjectHandle::newReal(str_v);
        }
    } else if (value.getString(str_v)) {
        int obj = 0;
        int gen = 0;
        std::string str;
        if (is_indirect_object(str_v, obj, gen)) {
            result = pdf.getObjectForJSON(obj, gen);
        } else if (is_unicode_string(str_v, str)) {
            result = QPDFObjectHandle::newUnicodeString(str);
        } else if (is_binary_string(str_v, str)) {
            result = QPDFObjectHandle::newString(QUtil::hex_decode(str));
        } else if (is_name(str_v)) {
            result = QPDFObjectHandle::newName(str_v);
        } else if (is_pdf_name(str_v)) {
            result = QPDFObjectHandle::parse(str_v.substr(2));
        } else {
            QTC::TC("qpdf", "QPDF_json unrecognized string value");
            error(value.getStart(), "unrecognized string value");
            result = QPDFObjectHandle::newNull();
        }
    }
    if (!result) {
        throw std::logic_error("JSONReactor::makeObject didn't initialize the object");
    }

    if (!result.hasObjectDescription()) {
        setObjectDescription(result, value);
    }
    return result;
}